

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec-ops.c
# Opt level: O1

axbStatus_t
test(axbVec_s *x0,axbVec_s *x1,axbVec_s *x2,axbVec_s *x3,axbScalar_s *alpha,axbScalar_s *beta,
    axbScalar_s *gamma,double *y0,double *y1,double *y2,double *y3,double a,double b,double c)

{
  axbVec_s *paVar1;
  axbStatus_t aVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  char *__format;
  double dVar6;
  size_t n;
  size_t idx0;
  axbScalar_s *scalars [3];
  axbVec_s *vecs [3];
  double local_c8;
  double local_c0;
  double *local_b8;
  axbVec_s *local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  axbScalar_s *local_90;
  double local_88;
  double local_80;
  double local_78;
  axbVec_s *local_70;
  axbScalar_s *local_68;
  axbScalar_s *local_60;
  axbScalar_s *local_58;
  axbVec_s *local_48;
  axbVec_s *local_40;
  axbVec_s *local_38;
  
  local_a8 = a;
  local_80 = c;
  local_78 = b;
  local_70 = x3;
  aVar2 = axbVecGetSize(x1,(size_t *)&local_c8);
  if (aVar2 == 0) {
    local_b0 = x2;
    local_90 = beta;
    pdVar3 = (double *)malloc((long)local_c8 << 3);
    local_98 = 0.0;
    aVar2 = axbVecSet(x0,alpha);
    if (aVar2 == 0) {
      if (local_c8 != 0.0) {
        dVar4 = 0.0;
        do {
          y0[(long)dVar4] = local_a8;
          dVar4 = (double)((long)dVar4 + 1);
        } while (local_c8 != dVar4);
      }
      local_b8 = pdVar3;
      check_equal(x0,y0,pdVar3,"axbVecSet");
      aVar2 = axbVecSqrtAbs(x0);
      if (aVar2 == 0) {
        if (local_c8 != 0.0) {
          dVar4 = 0.0;
          do {
            dVar6 = ABS(y0[(long)dVar4]);
            if (dVar6 < 0.0) {
              dVar6 = sqrt(dVar6);
            }
            else {
              dVar6 = SQRT(dVar6);
            }
            y0[(long)dVar4] = dVar6;
            dVar4 = (double)((long)dVar4 + 1);
          } while ((ulong)dVar4 < (ulong)local_c8);
        }
        check_equal(x0,y0,local_b8,"axbVecSqrtAbs");
        aVar2 = axbVecZero(x0);
        if (aVar2 == 0) {
          if (local_c8 != 0.0) {
            memset(y0,0,(long)local_c8 << 3);
          }
          check_equal(x0,y0,local_b8,"axbVecZero");
          aVar2 = axbVecScale(x1,alpha);
          if (aVar2 == 0) {
            if (local_c8 != 0.0) {
              dVar4 = 0.0;
              do {
                y1[(long)dVar4] = y1[(long)dVar4] * local_a8;
                dVar4 = (double)((long)dVar4 + 1);
              } while (local_c8 != dVar4);
            }
            check_equal(x1,y1,local_b8,"axbVecScale");
            aVar2 = axbVecSum(x1,alpha);
            if (aVar2 == 0) {
              dVar4 = 0.0;
              if (local_c8 != 0.0) {
                dVar6 = 0.0;
                do {
                  dVar4 = dVar4 + y1[(long)dVar6];
                  dVar6 = (double)((long)dVar6 + 1);
                } while (local_c8 != dVar6);
              }
              check_equal_scalar(alpha,dVar4,"axbVecSum");
              aVar2 = axbVecDot(x1,local_b0,alpha);
              if (aVar2 == 0) {
                dVar4 = 0.0;
                if (local_c8 != 0.0) {
                  dVar6 = 0.0;
                  do {
                    dVar4 = dVar4 + y1[(long)dVar6] * y2[(long)dVar6];
                    dVar6 = (double)((long)dVar6 + 1);
                  } while (local_c8 != dVar6);
                }
                check_equal_scalar(alpha,dVar4,"axbVecDot");
                aVar2 = axbVecTDot(x1,local_b0,alpha);
                if (aVar2 == 0) {
                  dVar4 = 0.0;
                  if (local_c8 != 0.0) {
                    dVar6 = 0.0;
                    do {
                      dVar4 = dVar4 + y1[(long)dVar6] * y2[(long)dVar6];
                      dVar6 = (double)((long)dVar6 + 1);
                    } while (local_c8 != dVar6);
                  }
                  check_equal_scalar(alpha,dVar4,"axbVecTDot");
                  aVar2 = axbVecNorm1(x1,alpha);
                  if (aVar2 == 0) {
                    dVar4 = 0.0;
                    if (local_c8 != 0.0) {
                      dVar6 = 0.0;
                      do {
                        dVar4 = dVar4 + ABS(y1[(long)dVar6]);
                        dVar6 = (double)((long)dVar6 + 1);
                      } while (local_c8 != dVar6);
                    }
                    check_equal_scalar(alpha,dVar4,"axbVecNorm1");
                    aVar2 = axbVecNorm2(x1,alpha);
                    if (aVar2 == 0) {
                      dVar4 = 0.0;
                      if (local_c8 != 0.0) {
                        dVar6 = 0.0;
                        do {
                          dVar4 = dVar4 + y1[(long)dVar6] * y1[(long)dVar6];
                          dVar6 = (double)((long)dVar6 + 1);
                        } while (local_c8 != dVar6);
                      }
                      if (dVar4 < 0.0) {
                        dVar4 = sqrt(dVar4);
                      }
                      else {
                        dVar4 = SQRT(dVar4);
                      }
                      check_equal_scalar(alpha,dVar4,"axbVecNorm2");
                      aVar2 = axbVecNormInf(x1,alpha);
                      if (aVar2 == 0) {
                        if (local_c8 == 0.0) {
                          dVar4 = 0.0;
                        }
                        else {
                          dVar5 = 0.0;
                          dVar6 = 0.0;
                          do {
                            dVar4 = ABS(y1[(long)dVar5]);
                            if (ABS(y1[(long)dVar5]) <= dVar6) {
                              dVar4 = dVar6;
                            }
                            dVar5 = (double)((long)dVar5 + 1);
                            dVar6 = dVar4;
                          } while (local_c8 != dVar5);
                        }
                        check_equal_scalar(alpha,dVar4,"axbVecNormInf");
                        aVar2 = axbVecDotNorm2(x1,local_b0,alpha,local_90);
                        if (aVar2 == 0) {
                          local_98 = 0.0;
                          dVar4 = 0.0;
                          local_c0 = 0.0;
                          if (local_c8 != 0.0) {
                            local_c0 = 0.0;
                            dVar6 = 0.0;
                            do {
                              dVar5 = y2[(long)dVar6];
                              dVar4 = dVar4 + y1[(long)dVar6] * dVar5;
                              local_c0 = local_c0 + dVar5 * dVar5;
                              dVar6 = (double)((long)dVar6 + 1);
                              local_98 = dVar4;
                            } while (local_c8 != dVar6);
                          }
                          check_equal_scalar(alpha,local_98,"axbVecDotNorm2, alpha");
                          if (local_c0 < 0.0) {
                            dVar4 = sqrt(local_c0);
                          }
                          else {
                            dVar4 = SQRT(local_c0);
                          }
                          check_equal_scalar(local_90,dVar4,"axbVecDotNorm2, beta");
                          local_88 = 0.0;
                          aVar2 = axbVecMax(x1,(size_t *)&local_88,alpha);
                          if (aVar2 == 0) {
                            local_c0 = *y1;
                            if ((ulong)local_c8 < 2) {
                              local_a0 = 0.0;
                            }
                            else {
                              dVar4 = 4.94065645841247e-324;
                              local_a0 = 0.0;
                              do {
                                dVar6 = y1[(long)dVar4];
                                dVar5 = dVar4;
                                if (y1[(long)dVar4] <= local_c0) {
                                  dVar6 = local_c0;
                                  dVar5 = local_a0;
                                }
                                local_a0 = dVar5;
                                local_c0 = dVar6;
                                dVar4 = (double)((long)dVar4 + 1);
                              } while (local_c8 != dVar4);
                            }
                            aVar2 = axbScalarGetValue(alpha,&local_98,AXB_REAL_DOUBLE);
                            if (aVar2 == 0) {
                              if (local_88 != local_a0) {
                                __format = 
                                "ERROR: index mismatch for axbVecMax: %ld (%g) vs. %ld (%g)\n";
                                dVar4 = local_a0;
                                dVar6 = local_c0;
LAB_00106c4f:
                                fprintf(_stderr,__format,local_98,dVar6,local_88,dVar4);
                                exit(1);
                              }
                              check_equal_scalar(alpha,local_c0,"axbVecMax");
                              local_88 = 0.0;
                              aVar2 = axbVecMin(x1,(size_t *)&local_88,alpha);
                              if (aVar2 == 0) {
                                local_a0 = *y1;
                                if ((ulong)local_c8 < 2) {
                                  local_c0 = 0.0;
                                }
                                else {
                                  dVar4 = 4.94065645841247e-324;
                                  local_c0 = 0.0;
                                  do {
                                    dVar6 = y1[(long)dVar4];
                                    dVar5 = dVar4;
                                    if (local_a0 <= y1[(long)dVar4]) {
                                      dVar6 = local_a0;
                                      dVar5 = local_c0;
                                    }
                                    local_c0 = dVar5;
                                    local_a0 = dVar6;
                                    dVar4 = (double)((long)dVar4 + 1);
                                  } while (local_c8 != dVar4);
                                }
                                aVar2 = axbScalarGetValue(alpha,&local_98,AXB_REAL_DOUBLE);
                                if (aVar2 == 0) {
                                  if (local_88 != local_c0) {
                                    __format = 
                                    "ERROR: index mismatch for axbVecMin: %ld (%g) vs. %ld (%g)\n";
                                    dVar4 = local_c0;
                                    dVar6 = local_a0;
                                    goto LAB_00106c4f;
                                  }
                                  check_equal_scalar(alpha,local_a0,"axbVecMin");
                                  aVar2 = axbVecCopy(x1,x0);
                                  pdVar3 = local_b8;
                                  if (aVar2 == 0) {
                                    if (local_c8 != 0.0) {
                                      dVar4 = 0.0;
                                      do {
                                        y0[(long)dVar4] = y1[(long)dVar4];
                                        dVar4 = (double)((long)dVar4 + 1);
                                      } while (local_c8 != dVar4);
                                    }
                                    check_equal(x0,y0,local_b8,"axbVecCopy, x0");
                                    check_equal(x1,y1,pdVar3,"axbVecCopy, x1");
                                    aVar2 = axbVecSwap(x0,local_b0);
                                    pdVar3 = local_b8;
                                    if (aVar2 == 0) {
                                      if (local_c8 != 0.0) {
                                        dVar4 = 0.0;
                                        do {
                                          dVar6 = y0[(long)dVar4];
                                          y0[(long)dVar4] = y2[(long)dVar4];
                                          y2[(long)dVar4] = dVar6;
                                          dVar4 = (double)((long)dVar4 + 1);
                                        } while (local_c8 != dVar4);
                                      }
                                      check_equal(x0,y0,local_b8,"axbVecSwap, x0");
                                      check_equal(local_b0,y2,pdVar3,"axbVecSwap, x2");
                                      aVar2 = axbScalarGetValue(alpha,&local_a8,AXB_REAL_DOUBLE);
                                      if (aVar2 == 0) {
                                        aVar2 = axbScalarGetValue(local_90,&local_78,AXB_REAL_DOUBLE
                                                                 );
                                        if (aVar2 == 0) {
                                          aVar2 = axbScalarGetValue(gamma,&local_80,AXB_REAL_DOUBLE)
                                          ;
                                          if (aVar2 == 0) {
                                            aVar2 = axbVecAXPY(x0,alpha,x1);
                                            if (aVar2 == 0) {
                                              if (local_c8 != 0.0) {
                                                dVar4 = 0.0;
                                                do {
                                                  y0[(long)dVar4] =
                                                       y1[(long)dVar4] * local_a8 + y0[(long)dVar4];
                                                  dVar4 = (double)((long)dVar4 + 1);
                                                } while (local_c8 != dVar4);
                                              }
                                              check_equal(x0,y0,local_b8,"axbVecAXPY");
                                              aVar2 = axbVecAYPX(x0,alpha,x1);
                                              if (aVar2 == 0) {
                                                if (local_c8 != 0.0) {
                                                  dVar4 = 0.0;
                                                  do {
                                                    y0[(long)dVar4] =
                                                         y0[(long)dVar4] * local_a8 +
                                                         y1[(long)dVar4];
                                                    dVar4 = (double)((long)dVar4 + 1);
                                                  } while (local_c8 != dVar4);
                                                }
                                                check_equal(x0,y0,local_b8,"axbVecAYPX");
                                                aVar2 = axbVecAXPBYPCZ(local_b0,alpha,local_90,gamma
                                                                       ,x0,x1);
                                                paVar1 = local_b0;
                                                if (aVar2 == 0) {
                                                  if (local_c8 != 0.0) {
                                                    dVar4 = 0.0;
                                                    do {
                                                      y2[(long)dVar4] =
                                                           y2[(long)dVar4] * local_80 +
                                                           y0[(long)dVar4] * local_a8 +
                                                           y1[(long)dVar4] * local_78;
                                                      dVar4 = (double)((long)dVar4 + 1);
                                                    } while (local_c8 != dVar4);
                                                  }
                                                  check_equal(local_b0,y2,local_b8,"axbVecAXPBYPCZ")
                                                  ;
                                                  aVar2 = axbVecWAXPY(paVar1,alpha,x0,x1);
                                                  paVar1 = local_b0;
                                                  if (aVar2 == 0) {
                                                    if (local_c8 != 0.0) {
                                                      dVar4 = 0.0;
                                                      do {
                                                        y2[(long)dVar4] =
                                                             y0[(long)dVar4] * local_a8 +
                                                             y1[(long)dVar4];
                                                        dVar4 = (double)((long)dVar4 + 1);
                                                      } while (local_c8 != dVar4);
                                                    }
                                                    check_equal(local_b0,y2,local_b8,"axbVecWAXPY");
                                                    local_40 = paVar1;
                                                    local_38 = local_70;
                                                    local_60 = local_90;
                                                    local_58 = gamma;
                                                    local_68 = alpha;
                                                    local_48 = x1;
                                                    aVar2 = axbVecMAXPY(x0,3,&local_68,&local_48);
                                                    if (aVar2 == 0) {
                                                      if (local_c8 != 0.0) {
                                                        dVar4 = 0.0;
                                                        do {
                                                          y0[(long)dVar4] =
                                                               y3[(long)dVar4] * local_80 +
                                                               y1[(long)dVar4] * local_a8 +
                                                               y2[(long)dVar4] * local_78 +
                                                               y0[(long)dVar4];
                                                          dVar4 = (double)((long)dVar4 + 1);
                                                        } while (local_c8 != dVar4);
                                                      }
                                                      check_equal(x0,y0,local_b8,"axbVecMAXPY");
                                                      aVar2 = axbVecPointwiseMult(x0,x1,local_b0);
                                                      if (aVar2 == 0) {
                                                        if (local_c8 != 0.0) {
                                                          dVar4 = 0.0;
                                                          do {
                                                            y0[(long)dVar4] =
                                                                 y1[(long)dVar4] * y2[(long)dVar4];
                                                            dVar4 = (double)((long)dVar4 + 1);
                                                          } while (local_c8 != dVar4);
                                                        }
                                                        check_equal(x0,y0,local_b8,
                                                                    "axbVecPointwiseMult");
                                                        aVar2 = axbVecPointwiseDivide
                                                                          (x0,x1,local_b0);
                                                        pdVar3 = local_b8;
                                                        if (aVar2 == 0) {
                                                          if (local_c8 != 0.0) {
                                                            dVar4 = 0.0;
                                                            do {
                                                              y0[(long)dVar4] =
                                                                   y1[(long)dVar4] / y2[(long)dVar4]
                                                              ;
                                                              dVar4 = (double)((long)dVar4 + 1);
                                                            } while (local_c8 != dVar4);
                                                          }
                                                          check_equal(x0,y0,local_b8,
                                                                      "axbVecPointwiseDivide");
                                                          free(pdVar3);
                                                          aVar2 = 0;
                                                        }
                                                        else {
                                                          test_cold_28();
                                                        }
                                                      }
                                                      else {
                                                        test_cold_27();
                                                      }
                                                    }
                                                    else {
                                                      test_cold_26();
                                                    }
                                                  }
                                                  else {
                                                    test_cold_25();
                                                  }
                                                }
                                                else {
                                                  test_cold_24();
                                                }
                                              }
                                              else {
                                                test_cold_23();
                                              }
                                            }
                                            else {
                                              test_cold_22();
                                            }
                                          }
                                          else {
                                            test_cold_21();
                                          }
                                        }
                                        else {
                                          test_cold_20();
                                        }
                                      }
                                      else {
                                        test_cold_19();
                                      }
                                    }
                                    else {
                                      test_cold_18();
                                    }
                                  }
                                  else {
                                    test_cold_17();
                                  }
                                }
                                else {
                                  test_cold_16();
                                }
                              }
                              else {
                                test_cold_15();
                              }
                            }
                            else {
                              test_cold_14();
                            }
                          }
                          else {
                            test_cold_13();
                          }
                        }
                        else {
                          test_cold_12();
                        }
                      }
                      else {
                        test_cold_11();
                      }
                    }
                    else {
                      test_cold_10();
                    }
                  }
                  else {
                    test_cold_9();
                  }
                }
                else {
                  test_cold_8();
                }
              }
              else {
                test_cold_7();
              }
            }
            else {
              test_cold_6();
            }
          }
          else {
            test_cold_5();
          }
        }
        else {
          test_cold_4();
        }
      }
      else {
        test_cold_3();
      }
    }
    else {
      test_cold_2();
    }
  }
  else {
    test_cold_1();
  }
  return aVar2;
}

Assistant:

axbStatus_t test(struct axbVec_s *x0, struct axbVec_s *x1, struct axbVec_s *x2, struct axbVec_s *x3, struct axbScalar_s *alpha, struct axbScalar_s *beta, struct axbScalar_s *gamma,
                 double *y0, double *y1, double *y2, double *y3, double a, double b, double c)
{
  size_t n;
  AXB_ERR_CHECK(axbVecGetSize(x1, &n));
  double *temp = malloc(sizeof(double) * n);
  double t = 0;
  double s = 0;



  //
  // in-place operations
  //

  // AXB_OP_VEC_SET
  AXB_ERR_CHECK(axbVecSet(x0, alpha));
  for (size_t i=0; i<n; ++i) y0[i] = a;
  check_equal(x0, y0, temp, "axbVecSet");

  // AXB_OP_VEC_SQRTABS
  AXB_ERR_CHECK(axbVecSqrtAbs(x0));
  for (size_t i=0; i<n; ++i) y0[i] = sqrt(fabs(y0[i]));
  check_equal(x0, y0, temp, "axbVecSqrtAbs");

  // AXB_OP_VEC_ZERO
  AXB_ERR_CHECK(axbVecZero(x0));
  for (size_t i=0; i<n; ++i) y0[i] = 0;
  check_equal(x0, y0, temp, "axbVecZero");

  // AXB_OP_VEC_SCALE
  AXB_ERR_CHECK(axbVecScale(x1, alpha));
  for (size_t i=0; i<n; ++i) y1[i] *= a;
  check_equal(x1, y1, temp, "axbVecScale");



  //
  // reduction operations
  //

  //AXB_OP_VEC_SUM
  AXB_ERR_CHECK(axbVecSum(x1, alpha));
  t=0;
  for (size_t i=0; i<n; ++i) t += y1[i];
  check_equal_scalar(alpha, t, "axbVecSum");


  //AXB_OP_VEC_DOT
  AXB_ERR_CHECK(axbVecDot(x1, x2, alpha));
  t=0;
  for (size_t i=0; i<n; ++i) t += y1[i] * y2[i];
  check_equal_scalar(alpha, t, "axbVecDot");

  //AXB_OP_VEC_TDOT
  AXB_ERR_CHECK(axbVecTDot(x1, x2, alpha));
  t=0;
  for (size_t i=0; i<n; ++i) t += y1[i] * y2[i];
  check_equal_scalar(alpha, t, "axbVecTDot");

  //AXB_OP_VEC_MDOT
  // skipping: tested separately

  //AXB_OP_VEC_NORM1
  AXB_ERR_CHECK(axbVecNorm1(x1, alpha));
  t=0;
  for (size_t i=0; i<n; ++i) t += fabs(y1[i]);
  check_equal_scalar(alpha, t, "axbVecNorm1");

  //AXB_OP_VEC_NORM2
  AXB_ERR_CHECK(axbVecNorm2(x1, alpha));
  t=0;
  for (size_t i=0; i<n; ++i) t += y1[i] * y1[i];
  check_equal_scalar(alpha, sqrt(t), "axbVecNorm2");

  //AXB_OP_VEC_NORMINF
  AXB_ERR_CHECK(axbVecNormInf(x1, alpha));
  t=0;
  for (size_t i=0; i<n; ++i) t = fabs(y1[i]) > t ? fabs(y1[i]) : t;
  check_equal_scalar(alpha, t, "axbVecNormInf");

  //AXB_OP_VEC_DOTNORM2
  AXB_ERR_CHECK(axbVecDotNorm2(x1, x2, alpha, beta));
  t=0;
  s=0;
  for (size_t i=0; i<n; ++i) { s += y1[i] * y2[i]; t += y2[i] * y2[i]; }
  check_equal_scalar(alpha, s, "axbVecDotNorm2, alpha");
  check_equal_scalar(beta, sqrt(t), "axbVecDotNorm2, beta");

  //AXB_OP_VEC_MAX
  size_t idx0 = 0;
  AXB_ERR_CHECK(axbVecMax(x1, &idx0, alpha));
  t=y1[0];
  size_t idx1 = 0;
  for (size_t i=1; i<n; ++i) {
    if (y1[i] > t) { idx1 = i; t = y1[i]; }
  }
  AXB_ERR_CHECK(axbScalarGetValue(alpha, &s, AXB_REAL_DOUBLE));
  if (idx0 != idx1) { fprintf(stderr, "ERROR: index mismatch for axbVecMax: %ld (%g) vs. %ld (%g)\n", idx0, s, idx1, t); exit(EXIT_FAILURE); }
  check_equal_scalar(alpha, t, "axbVecMax");

  //AXB_OP_VEC_MIN
  idx0 = 0;
  AXB_ERR_CHECK(axbVecMin(x1, &idx0, alpha));
  t=y1[0];
  idx1 = 0;
  for (size_t i=1; i<n; ++i) {
    if (y1[i] < t) { idx1 = i; t = y1[i]; }
  }
  AXB_ERR_CHECK(axbScalarGetValue(alpha, &s, AXB_REAL_DOUBLE));
  if (idx0 != idx1) { fprintf(stderr, "ERROR: index mismatch for axbVecMin: %ld (%g) vs. %ld (%g)\n", idx0, s, idx1, t); exit(EXIT_FAILURE); }
  check_equal_scalar(alpha, t, "axbVecMin");



  //
  // vector-vector operations
  //

  //AXB_OP_VEC_COPY
  AXB_ERR_CHECK(axbVecCopy(x1, x0));
  for (size_t i=0; i<n; ++i) y0[i] = y1[i];
  check_equal(x0, y0, temp, "axbVecCopy, x0");
  check_equal(x1, y1, temp, "axbVecCopy, x1");

  //AXB_OP_VEC_SWAP
  AXB_ERR_CHECK(axbVecSwap(x0, x2));
  for (size_t i=0; i<n; ++i) { t = y0[i]; y0[i] = y2[i]; y2[i] = t; }
  check_equal(x0, y0, temp, "axbVecSwap, x0");
  check_equal(x2, y2, temp, "axbVecSwap, x2");

  AXB_ERR_CHECK(axbScalarGetValue(alpha, &a, AXB_REAL_DOUBLE));  // reset
  AXB_ERR_CHECK(axbScalarGetValue(beta,  &b, AXB_REAL_DOUBLE));  // reset
  AXB_ERR_CHECK(axbScalarGetValue(gamma, &c, AXB_REAL_DOUBLE));  // reset

  //AXB_OP_VEC_AXPY
  AXB_ERR_CHECK(axbVecAXPY(x0, alpha, x1));
  for (size_t i=0; i<n; ++i) y0[i] += a * y1[i];
  check_equal(x0, y0, temp, "axbVecAXPY");

  //AXB_OP_VEC_AYPX
  AXB_ERR_CHECK(axbVecAYPX(x0, alpha, x1));
  for (size_t i=0; i<n; ++i) y0[i] = a * y0[i] + y1[i];
  check_equal(x0, y0, temp, "axbVecAYPX");

  //AXB_OP_VEC_AXPBYPCZ
  AXB_ERR_CHECK(axbVecAXPBYPCZ(x2, alpha, beta, gamma, x0, x1));
  for (size_t i=0; i<n; ++i) y2[i] = a * y0[i] + b * y1[i] + c * y2[i];
  check_equal(x2, y2, temp, "axbVecAXPBYPCZ");

  //AXB_OP_VEC_WAXPY
  AXB_ERR_CHECK(axbVecWAXPY(x2, alpha, x0, x1));
  for (size_t i=0; i<n; ++i) y2[i] = a * y0[i] + y1[i];
  check_equal(x2, y2, temp, "axbVecWAXPY");

  //AXB_OP_VEC_MAXPY
  struct axbVec_s *vecs[3] = {x1, x2, x3};
  struct axbScalar_s *scalars[3] = {alpha, beta, gamma};
  AXB_ERR_CHECK(axbVecMAXPY(x0, 3, (const struct axbScalar_s * const*)scalars, (const struct axbVec_s * const*)vecs));
  for (size_t i=0; i<n; ++i) y0[i] += a * y1[i] + b * y2[i] + c * y3[i];
  check_equal(x0, y0, temp, "axbVecMAXPY");

  //AXB_OP_VEC_POINTWISEMULT
  AXB_ERR_CHECK(axbVecPointwiseMult(x0, x1, x2));
  for (size_t i=0; i<n; ++i) y0[i] = y1[i] * y2[i];
  check_equal(x0, y0, temp, "axbVecPointwiseMult");

  //AXB_OP_VEC_POINTWISEDIV
  AXB_ERR_CHECK(axbVecPointwiseDivide(x0, x1, x2));
  for (size_t i=0; i<n; ++i) y0[i] = y1[i] / y2[i];
  check_equal(x0, y0, temp, "axbVecPointwiseDivide");

  free(temp);
  return 0;
}